

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_dec.c
# Opt level: O1

int jpc_dec_tiledecode(jpc_dec_t *dec,jpc_dec_tile_t *tile)

{
  byte bVar1;
  uint_fast8_t uVar2;
  char cVar3;
  jpc_dec_ccp_t *pjVar4;
  jas_matrix_t *pjVar5;
  ulong uVar6;
  long lVar7;
  jpc_dec_cmpt_t *pjVar8;
  bool bVar9;
  _Bool _Var10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  jpc_dec_tcomp_t *pjVar14;
  int iVar15;
  jas_seqent_t *pjVar16;
  jpc_tsfb_t **ppjVar17;
  int iVar18;
  ulong uVar19;
  jpc_dec_tcomp_t *pjVar20;
  long lVar21;
  jpc_dec_cmpt_t *pjVar22;
  ulong uVar23;
  jas_seqent_t jVar24;
  jpc_dec_band_t *pjVar25;
  long lVar26;
  long lVar27;
  int iVar28;
  char *fmt;
  jpc_dec_rlvl_t *pjVar29;
  long local_88;
  
  iVar11 = jpc_dec_decodecblks(dec,tile);
  if (iVar11 == 0) {
    if (0 < dec->numcomps) {
      pjVar14 = tile->tcomps;
      local_88 = 0;
      do {
        if (pjVar14->numrlvls != 0) {
          pjVar29 = pjVar14->rlvls;
          pjVar4 = tile->cp->ccps;
          uVar12 = 0;
          do {
            pjVar25 = pjVar29->bands;
            if ((pjVar25 != (jpc_dec_band_t *)0x0) && (0 < pjVar29->numbands)) {
              iVar11 = 0;
              do {
                pjVar5 = pjVar25->data;
                if (pjVar5 != (jas_matrix_t *)0x0) {
                  iVar15 = pjVar25->numbps;
                  iVar28 = pjVar25->roishift;
                  bVar1 = pjVar4[local_88].roishift;
                  iVar18 = iVar28;
                  if (iVar28 < 0) {
                    iVar18 = 0;
                    jas_eprintf(
                               "warning: forcing negative ROI shift to zero (bitstream is probably corrupt)\n"
                               );
                  }
                  iVar28 = (uint)bVar1 - iVar28;
                  if ((iVar18 != 0 || iVar28 != 0) && (0 < pjVar5->numrows_)) {
                    uVar23 = -1L << ((byte)iVar15 & 0x3f);
                    lVar26 = 0;
                    bVar9 = false;
                    do {
                      if (0 < pjVar5->numcols_) {
                        lVar27 = 0;
                        do {
                          pjVar16 = pjVar5->rows_[lVar26];
                          uVar6 = pjVar16[lVar27];
                          uVar19 = -uVar6;
                          if (0 < (long)uVar6) {
                            uVar19 = uVar6;
                          }
                          if ((long)uVar19 < (long)(1 << ((byte)iVar18 & 0x1f))) {
                            uVar19 = uVar19 << ((byte)iVar28 & 0x3f);
                            if ((uVar19 & uVar23) != 0) {
                              if (!bVar9) {
                                jas_eprintf("warning: possibly corrupt code stream\n");
                                bVar9 = true;
                              }
                              uVar19 = uVar19 & ~uVar23;
                            }
                            uVar13 = -uVar19;
                            if (-1 < (long)uVar6) {
                              uVar13 = uVar19;
                            }
                            pjVar16 = pjVar5->rows_[lVar26];
                          }
                          else {
                            uVar19 = uVar19 >> ((byte)iVar18 & 0x3f);
                            uVar13 = -uVar19;
                            if (-1 < (long)uVar6) {
                              uVar13 = uVar19;
                            }
                          }
                          pjVar16[lVar27] = uVar13;
                          lVar27 = lVar27 + 1;
                        } while (lVar27 < pjVar5->numcols_);
                      }
                      lVar26 = lVar26 + 1;
                    } while (lVar26 < pjVar5->numrows_);
                  }
                  if (tile->realmode != 0) {
                    jas_matrix_asl(pjVar25->data,0xd);
                    lVar26 = pjVar25->absstepsize;
                    if (lVar26 < 0) {
                      __assert_fail("absstepsize >= 0",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/jpc/jpc_dec.c"
                                    ,0x797,"void jpc_dequantize(jas_matrix_t *, jpc_fix_t)");
                    }
                    if ((lVar26 != 0x2000) && (pjVar5 = pjVar25->data, 0 < pjVar5->numrows_)) {
                      lVar27 = 0;
                      do {
                        if (0 < pjVar5->numcols_) {
                          pjVar16 = pjVar5->rows_[lVar27];
                          lVar21 = 0;
                          do {
                            lVar7 = pjVar16[lVar21];
                            jVar24 = lVar7 * lVar26 >> 0xd;
                            if (lVar7 == 0) {
                              jVar24 = 0;
                            }
                            pjVar16[lVar21] = jVar24;
                            lVar21 = lVar21 + 1;
                          } while (lVar21 < pjVar5->numcols_);
                        }
                        lVar27 = lVar27 + 1;
                      } while (lVar27 < pjVar5->numrows_);
                    }
                  }
                }
                iVar11 = iVar11 + 1;
                pjVar25 = pjVar25 + 1;
              } while (iVar11 < pjVar29->numbands);
            }
            uVar12 = uVar12 + 1;
            pjVar29 = pjVar29 + 1;
          } while (uVar12 < pjVar14->numrlvls);
        }
        local_88 = local_88 + 1;
        pjVar14 = pjVar14 + 1;
      } while (local_88 < dec->numcomps);
    }
    if (dec->numcomps < 1) {
      bVar9 = true;
    }
    else {
      ppjVar17 = &tile->tcomps->tsfb;
      iVar11 = 0;
      do {
        jpc_tsfb_synthesize(*ppjVar17,(jas_seq2d_t *)ppjVar17[-3]);
        iVar11 = iVar11 + 1;
        ppjVar17 = ppjVar17 + 8;
      } while (iVar11 < dec->numcomps);
      bVar9 = dec->numcomps < 3;
    }
    uVar2 = tile->cp->mctid;
    if (uVar2 == '\x01') {
      if (bVar9) {
        fmt = "ICT requires at least three components\n";
        goto LAB_0011db73;
      }
      _Var10 = jas_image_cmpt_domains_same(dec->image);
      if (_Var10) {
        pjVar14 = tile->tcomps;
        jpc_iict(pjVar14->data,pjVar14[1].data,pjVar14[2].data);
        goto LAB_0011dede;
      }
    }
    else {
      if (uVar2 != '\x02') {
LAB_0011dede:
        if ((tile->realmode != 0) && (iVar11 = dec->numcomps, 0 < iVar11)) {
          pjVar14 = tile->tcomps;
          iVar15 = 0;
          do {
            pjVar5 = pjVar14->data;
            if (0 < pjVar5->numrows_) {
              lVar26 = 0;
              do {
                if (0 < pjVar5->numcols_) {
                  pjVar16 = pjVar5->rows_[lVar26];
                  lVar27 = 0;
                  do {
                    iVar28 = (int)pjVar16[lVar27];
                    if (iVar28 < 0) {
                      iVar28 = iVar28 + 0x1000;
                    }
                    else {
                      iVar28 = -(0x1000U - iVar28 & 0xffffe000);
                    }
                    pjVar16[lVar27] = (long)(iVar28 >> 0xd);
                    lVar27 = lVar27 + 1;
                  } while (lVar27 < pjVar5->numcols_);
                }
                lVar26 = lVar26 + 1;
              } while (lVar26 < pjVar5->numrows_);
            }
            iVar15 = iVar15 + 1;
            pjVar14 = pjVar14 + 1;
          } while (iVar15 != iVar11);
        }
        pjVar14 = tile->tcomps;
        pjVar8 = dec->cmpts;
        iVar11 = dec->numcomps;
        if (0 < iVar11) {
          iVar15 = 0;
          pjVar20 = pjVar14;
          pjVar22 = pjVar8;
          do {
            if (pjVar22->sgnd == false) {
              lVar26 = (long)(1 << ((char)pjVar22->prec - 1U & 0x1f));
            }
            else {
              lVar26 = 0;
            }
            pjVar5 = pjVar20->data;
            if (0 < pjVar5->numrows_) {
              lVar27 = 0;
              do {
                if (0 < pjVar5->numcols_) {
                  pjVar16 = pjVar5->rows_[lVar27];
                  lVar21 = 0;
                  do {
                    pjVar16[lVar21] = pjVar16[lVar21] + lVar26;
                    lVar21 = lVar21 + 1;
                  } while (lVar21 < pjVar5->numcols_);
                }
                lVar27 = lVar27 + 1;
              } while (lVar27 < pjVar5->numrows_);
            }
            iVar15 = iVar15 + 1;
            pjVar20 = pjVar20 + 1;
            pjVar22 = pjVar22 + 1;
          } while (iVar15 != iVar11);
        }
        if (0 < dec->numcomps) {
          iVar11 = 0;
          lVar26 = 0x20;
          do {
            cVar3 = *(char *)((long)&pjVar8->vstep + lVar26);
            if (cVar3 == '\x01') {
              jVar24 = (jas_seqent_t)(-1 << (*(char *)((long)&pjVar8->hstep + lVar26) - 1U & 0x1f));
            }
            else {
              jVar24 = 0;
            }
            jas_matrix_clip(*(jas_matrix_t **)((long)&pjVar14->xstart + lVar26),jVar24,
                            (ulong)(uint)~(-1 << ((char)*(undefined4 *)
                                                         ((long)&pjVar8->hstep + lVar26) - cVar3 &
                                                 0x1fU)));
            iVar11 = iVar11 + 1;
            lVar26 = lVar26 + 0x40;
          } while (iVar11 < dec->numcomps);
        }
        if (0 < dec->numcomps) {
          pjVar8 = dec->cmpts;
          pjVar14 = tile->tcomps;
          lVar26 = 0;
          fmt = "write component failed\n";
          uVar12 = 0;
          do {
            uVar23 = *(ulong *)((long)&pjVar8->hstep + lVar26);
            uVar6 = *(ulong *)((long)&pjVar8->vstep + lVar26);
            pjVar5 = *(jas_matrix_t **)((long)&pjVar14->data + lVar26);
            iVar11 = jas_image_writecmpt(dec->image,uVar12,
                                         *(long *)((long)&pjVar14->xstart + lVar26) -
                                         ((dec->xstart + uVar23) - 1) / uVar23,
                                         *(long *)((long)&pjVar14->ystart + lVar26) -
                                         ((dec->ystart + uVar6) - 1) / uVar6,pjVar5->numcols_,
                                         pjVar5->numrows_,pjVar5);
            if (iVar11 != 0) goto LAB_0011db73;
            uVar12 = uVar12 + 1;
            lVar26 = lVar26 + 0x40;
          } while ((int)uVar12 < dec->numcomps);
        }
        return 0;
      }
      if (bVar9) {
        fmt = "RCT requires at least three components\n";
        goto LAB_0011db73;
      }
      _Var10 = jas_image_cmpt_domains_same(dec->image);
      if (_Var10) {
        pjVar14 = tile->tcomps;
        jpc_irct(pjVar14->data,pjVar14[1].data,pjVar14[2].data);
        goto LAB_0011dede;
      }
    }
    fmt = "RCT requires all components have the same domain\n";
  }
  else {
    fmt = "jpc_dec_decodecblks failed\n";
  }
LAB_0011db73:
  jas_eprintf(fmt);
  return -1;
}

Assistant:

static int jpc_dec_tiledecode(jpc_dec_t *dec, jpc_dec_tile_t *tile)
{
	jpc_dec_tcomp_t *tcomp;
	jpc_dec_rlvl_t *rlvl;
	jpc_dec_band_t *band;
	int compno;
	unsigned rlvlno;
	int bandno;
	int adjust;
	int v;
	jpc_dec_ccp_t *ccp;
	jpc_dec_cmpt_t *cmpt;

	if (jpc_dec_decodecblks(dec, tile)) {
		jas_eprintf("jpc_dec_decodecblks failed\n");
		return -1;
	}

	/* Perform dequantization. */
	for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
	  ++compno, ++tcomp) {
		ccp = &tile->cp->ccps[compno];
		for (rlvlno = 0, rlvl = tcomp->rlvls; rlvlno < tcomp->numrlvls;
		  ++rlvlno, ++rlvl) {
			if (!rlvl->bands) {
				continue;
			}
			for (bandno = 0, band = rlvl->bands;
			  bandno < rlvl->numbands; ++bandno, ++band) {
				if (!band->data) {
					continue;
				}
				jpc_undo_roi(band->data, band->roishift, ccp->roishift -
				  band->roishift, band->numbps);
				if (tile->realmode) {
					jas_matrix_asl(band->data, JPC_FIX_FRACBITS);
					jpc_dequantize(band->data, band->absstepsize);
				}

			}
		}
	}

	/* Apply an inverse wavelet transform if necessary. */
	for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
	  ++compno, ++tcomp) {
		ccp = &tile->cp->ccps[compno];
		jpc_tsfb_synthesize(tcomp->tsfb, tcomp->data);
	}


	/* Apply an inverse intercomponent transform if necessary. */
	switch (tile->cp->mctid) {
	case JPC_MCT_RCT:
		if (dec->numcomps < 3) {
			jas_eprintf("RCT requires at least three components\n");
			return -1;
		}
		if (!jas_image_cmpt_domains_same(dec->image)) {
			jas_eprintf("RCT requires all components have the same domain\n");
			return -1;
		}
		jpc_irct(tile->tcomps[0].data, tile->tcomps[1].data,
		  tile->tcomps[2].data);
		break;
	case JPC_MCT_ICT:
		if (dec->numcomps < 3) {
			jas_eprintf("ICT requires at least three components\n");
			return -1;
		}
		if (!jas_image_cmpt_domains_same(dec->image)) {
			jas_eprintf("RCT requires all components have the same domain\n");
			return -1;
		}
		jpc_iict(tile->tcomps[0].data, tile->tcomps[1].data,
		  tile->tcomps[2].data);
		break;
	}

	/* Perform rounding and convert to integer values. */
	if (tile->realmode) {
		for (compno = 0, tcomp = tile->tcomps; compno < dec->numcomps;
		  ++compno, ++tcomp) {
			for (jas_matind_t i = 0; i < jas_matrix_numrows(tcomp->data); ++i) {
				for (jas_matind_t j = 0; j < jas_matrix_numcols(tcomp->data); ++j) {
					v = jas_matrix_get(tcomp->data, i, j);
					v = jpc_fix_round(v);
					jas_matrix_set(tcomp->data, i, j, jpc_fixtoint(v));
				}
			}
		}
	}

	/* Perform level shift. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		adjust = cmpt->sgnd ? 0 : (1 << (cmpt->prec - 1));
		for (jas_matind_t i = 0; i < jas_matrix_numrows(tcomp->data); ++i) {
			for (jas_matind_t j = 0; j < jas_matrix_numcols(tcomp->data); ++j) {
				*jas_matrix_getref(tcomp->data, i, j) += adjust;
			}
		}
	}

	/* Perform clipping. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		jpc_fix_t mn;
		jpc_fix_t mx;
		mn = cmpt->sgnd ? (-(1 << (cmpt->prec - 1))) : (0);
		mx = cmpt->sgnd ? ((1 << (cmpt->prec - 1)) - 1) : ((1 <<
		  cmpt->prec) - 1);
		jas_matrix_clip(tcomp->data, mn, mx);
	}

	/* XXX need to free tsfb struct */

	/* Write the data for each component of the image. */
	for (compno = 0, tcomp = tile->tcomps, cmpt = dec->cmpts; compno <
	  dec->numcomps; ++compno, ++tcomp, ++cmpt) {
		if (jas_image_writecmpt(dec->image, compno, tcomp->xstart -
		  JPC_CEILDIV(dec->xstart, cmpt->hstep), tcomp->ystart -
		  JPC_CEILDIV(dec->ystart, cmpt->vstep), jas_matrix_numcols(
		  tcomp->data), jas_matrix_numrows(tcomp->data), tcomp->data)) {
			jas_eprintf("write component failed\n");
			return -1;
		}
	}

	return 0;
}